

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioRead.c
# Opt level: O2

void Mio_LibrarySortGates(Mio_Library_t *pLib)

{
  uint uVar1;
  Mio_Gate_t **__base;
  Mio_Gate_t *pMVar2;
  Mio_Gate_t **ppMVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  __base = (Mio_Gate_t **)malloc((long)pLib->nGates << 3);
  pMVar2 = Mio_LibraryReadGates(pLib);
  lVar7 = 0;
  uVar6 = 0;
  while (iVar5 = (int)uVar6, pMVar2 != (Mio_Gate_t *)0x0) {
    pMVar2->Cell = iVar5;
    __base[uVar6] = pMVar2;
    uVar6 = uVar6 + 1;
    pMVar2 = Mio_GateReadNext(pMVar2);
    lVar7 = lVar7 + 0x100000000;
  }
  if (pLib->nGates == iVar5) {
    ppMVar3 = (Mio_Gate_t **)malloc(lVar7 >> 0x1d);
    pLib->ppGates0 = ppMVar3;
    uVar4 = 0;
    uVar6 = uVar6 & 0xffffffff;
    if (iVar5 < 1) {
      uVar6 = uVar4;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      pLib->ppGates0[uVar4] = __base[uVar4];
    }
    qsort(__base,lVar7 >> 0x20,8,Mio_LibraryCompareGatesByName);
    uVar1 = pLib->nGates;
    uVar6 = 0;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      if ((long)uVar6 < (long)(int)uVar1 + -1) {
        pMVar2 = __base[uVar6 + 1];
      }
      else {
        pMVar2 = (Mio_Gate_t *)0x0;
      }
      __base[uVar6]->pNext = pMVar2;
    }
    pLib->pGates = *__base;
    pLib->ppGatesName = __base;
    return;
  }
  __assert_fail("i == pLib->nGates",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioRead.c"
                ,0x251,"void Mio_LibrarySortGates(Mio_Library_t *)");
}

Assistant:

void Mio_LibrarySortGates( Mio_Library_t * pLib )
{
    Mio_Gate_t ** ppGates, * pGate;
    int i = 0;
    ppGates = ABC_ALLOC( Mio_Gate_t *, pLib->nGates );
    Mio_LibraryForEachGate( pLib, pGate )
    {
        pGate->Cell = i;
        ppGates[i++] = pGate;
    }
    assert( i == pLib->nGates );
    // sort gates by name
    pLib->ppGates0 = ABC_ALLOC( Mio_Gate_t *, pLib->nGates );
    for ( i = 0; i < pLib->nGates; i++ )
        pLib->ppGates0[i] = ppGates[i];
    qsort( (void *)ppGates, (size_t)pLib->nGates, sizeof(void *), 
            (int (*)(const void *, const void *)) Mio_LibraryCompareGatesByName );
    for ( i = 0; i < pLib->nGates; i++ )
        ppGates[i]->pNext = (i < pLib->nGates-1)? ppGates[i+1] : NULL;
    pLib->pGates = ppGates[0];
    pLib->ppGatesName = ppGates;
}